

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.cpp
# Opt level: O3

void __thiscall
qclab::qgates::QGate1<std::complex<float>_>::apply
          (QGate1<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  _ComplexT _Var1;
  complex<float> cVar2;
  complex<float> *pcVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Db;
  undefined8 uVar18;
  float extraout_XMM0_Db_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  SquareMatrix<std::complex<float>_> local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  SquareMatrix<std::complex<float>_> local_68;
  SquareMatrix<std::complex<float>_> local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  if (nbQubits < 1) {
    __assert_fail("nbQubits >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/src/qgates/QGate1.cpp"
                  ,0x1f,
                  "virtual void qclab::qgates::QGate1<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/src/qgates/QGate1.cpp"
                  ,0x20,
                  "virtual void qclab::qgates::QGate1<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  iVar4 = (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[3])();
  uVar5 = iVar4 + offset;
  if (nbQubits <= (int)uVar5) {
    __assert_fail("qubit < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O3/_deps/qclabpp-src/src/qgates/QGate1.cpp"
                  ,0x22,
                  "virtual void qclab::qgates::QGate1<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
                 );
  }
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(&local_c8,this);
  dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(op,&local_c8);
  if (side == Left) {
    if (nbQubits == 1) {
      dense::SquareMatrix<std::complex<float>_>::operator*=(matrix,&local_c8);
    }
    else {
      lVar11 = matrix->size_;
      if (0 < lVar11) {
        lVar15 = (long)(1 << ((byte)(~uVar5 + nbQubits) & 0x1f));
        uVar9 = 1 << ((byte)uVar5 & 0x1f);
        lVar10 = 1;
        if (1 < lVar15) {
          lVar10 = lVar15;
        }
        if ((int)uVar9 < 2) {
          uVar9 = 1;
        }
        lVar14 = 0;
        do {
          if (uVar5 != 0x1f) {
            lVar11 = 0;
            uVar6 = 0;
            do {
              lVar12 = lVar10;
              lVar13 = lVar11;
              if (~uVar5 + nbQubits != 0x1f) {
                do {
                  pcVar3 = (matrix->data_)._M_t.
                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                  lVar8 = matrix->size_ * lVar13;
                  fVar17 = *(float *)&pcVar3[lVar8 + lVar14]._M_value;
                  fVar21 = *(float *)((long)&pcVar3[lVar8 + lVar14]._M_value + 4);
                  _Var1 = pcVar3[matrix->size_ * (lVar15 + lVar13) + lVar14]._M_value;
                  fVar31 = (float)(_Var1 >> 0x20);
                  cVar2._M_value =
                       *(_ComplexT *)
                        local_c8.data_._M_t.
                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                        .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                  fVar16 = (float)(cVar2._M_value >> 0x20);
                  fVar27 = fVar17 * (float)cVar2._M_value - fVar21 * fVar16;
                  fVar28 = fVar17 * 0.0 - fVar21 * 0.0;
                  fVar29 = fVar17 * 0.0 - fVar21 * 0.0;
                  fVar22 = fVar17 * fVar16 + fVar21 * (float)cVar2._M_value;
                  fVar30 = (float)_Var1;
                  uVar32 = 0;
                  uVar33 = 0;
                  uVar34 = 0;
                  uVar35 = 0;
                  uVar36 = 0;
                  uVar37 = 0;
                  uVar38 = 0;
                  uVar39 = 0;
                  fVar20 = fVar17;
                  fVar40 = fVar17;
                  fVar23 = fVar17;
                  fVar24 = fVar17;
                  fVar26 = fVar21;
                  fVar41 = fVar21;
                  fVar42 = fVar21;
                  fVar43 = fVar21;
                  if ((NAN(fVar27)) && (NAN(fVar22))) {
                    uStack_b0 = 0;
                    local_78 = ZEXT416((uint)fVar17);
                    local_88 = ZEXT416((uint)fVar21);
                    local_b8 = _Var1;
                    local_a8 = fVar21;
                    fStack_a4 = fVar21;
                    fStack_a0 = fVar21;
                    fStack_9c = fVar21;
                    local_98 = fVar17;
                    fStack_94 = fVar17;
                    fStack_90 = fVar17;
                    fStack_8c = fVar17;
                    uVar18 = __mulsc3(cVar2._M_value,fVar16,fVar17,fVar21);
                    fVar27 = (float)uVar18;
                    fVar22 = (float)((ulong)uVar18 >> 0x20);
                    fVar28 = (float)extraout_XMM0_Qb;
                    fVar29 = (float)((ulong)extraout_XMM0_Qb >> 0x20);
                    fVar30 = (float)local_b8;
                    fVar31 = local_b8._4_4_;
                    uVar32 = (undefined4)uStack_b0;
                    uVar33 = uStack_b0._4_4_;
                    fVar17 = (float)local_78._0_4_;
                    uVar34 = local_78._4_4_;
                    uVar35 = local_78._8_4_;
                    uVar36 = local_78._12_4_;
                    fVar21 = (float)local_88._0_4_;
                    uVar37 = local_88._4_4_;
                    uVar38 = local_88._8_4_;
                    uVar39 = local_88._12_4_;
                    fVar20 = local_98;
                    fVar40 = fStack_94;
                    fVar23 = fStack_90;
                    fVar24 = fStack_8c;
                    fVar26 = local_a8;
                    fVar41 = fStack_a4;
                    fVar42 = fStack_a0;
                    fVar43 = fStack_9c;
                  }
                  _Var1 = ((complex<float> *)
                          ((long)local_c8.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                 .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl +
                          8))->_M_value;
                  fVar25 = (float)(_Var1 >> 0x20);
                  fVar16 = fVar30 * (float)_Var1 - fVar31 * fVar25;
                  fVar19 = (float)_Var1 * fVar31 + fVar25 * fVar30;
                  if ((NAN(fVar16)) && (NAN(fVar19))) {
                    local_b8 = CONCAT44(fVar31,fVar30);
                    uStack_b0 = CONCAT44(uVar33,uVar32);
                    local_78._4_4_ = uVar34;
                    local_78._0_4_ = fVar17;
                    local_78._8_4_ = uVar35;
                    local_78._12_4_ = uVar36;
                    local_88._4_4_ = uVar37;
                    local_88._0_4_ = fVar21;
                    local_88._8_4_ = uVar38;
                    local_88._12_4_ = uVar39;
                    local_a8 = fVar26;
                    fStack_a4 = fVar41;
                    fStack_a0 = fVar42;
                    fStack_9c = fVar43;
                    local_98 = fVar20;
                    fStack_94 = fVar40;
                    fStack_90 = fVar23;
                    fStack_8c = fVar24;
                    local_48 = fVar27;
                    fStack_44 = fVar22;
                    fStack_40 = fVar28;
                    fStack_3c = fVar29;
                    __mulsc3(_Var1,fVar25,CONCAT44(fVar31,fVar30),fVar31);
                    fVar30 = (float)local_b8;
                    fVar31 = local_b8._4_4_;
                    uVar32 = (undefined4)uStack_b0;
                    uVar33 = uStack_b0._4_4_;
                    fVar17 = (float)local_78._0_4_;
                    uVar34 = local_78._4_4_;
                    fVar21 = (float)local_88._0_4_;
                    fVar20 = local_98;
                    fVar40 = fStack_94;
                    fVar23 = fStack_90;
                    fVar24 = fStack_8c;
                    fVar26 = local_a8;
                    fVar41 = fStack_a4;
                    fVar42 = fStack_a0;
                    fVar43 = fStack_9c;
                    fVar27 = local_48;
                    fVar22 = fStack_44;
                    fVar16 = extraout_XMM0_Da;
                    fVar19 = extraout_XMM0_Db;
                  }
                  (matrix->data_)._M_t.
                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                  [matrix->size_ * lVar13 + lVar14]._M_value =
                       CONCAT44(fVar22 + fVar19,fVar27 + fVar16);
                  _Var1 = ((complex<float> *)
                          ((long)local_c8.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                 .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl +
                          local_c8.size_ * 8))->_M_value;
                  fVar27 = (float)(_Var1 >> 0x20);
                  fVar20 = fVar20 * (float)_Var1 - fVar41 * fVar27;
                  fVar23 = fVar23 * 0.0 - fVar42 * 0.0;
                  fVar24 = fVar24 * 0.0 - fVar43 * 0.0;
                  fVar40 = fVar40 * fVar27 + fVar26 * (float)_Var1;
                  if ((NAN(fVar20)) && (NAN(fVar40))) {
                    local_b8 = CONCAT44(fVar31,fVar30);
                    uStack_b0 = CONCAT44(uVar33,uVar32);
                    uVar18 = __mulsc3(_Var1,fVar27,CONCAT44(uVar34,fVar17),fVar21);
                    fVar20 = (float)uVar18;
                    fVar40 = (float)((ulong)uVar18 >> 0x20);
                    fVar23 = (float)extraout_XMM0_Qb_00;
                    fVar24 = (float)((ulong)extraout_XMM0_Qb_00 >> 0x20);
                    fVar30 = (float)local_b8;
                    fVar31 = local_b8._4_4_;
                  }
                  _Var1 = ((complex<float> *)
                          ((long)local_c8.data_._M_t.
                                 super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                 .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl +
                          (local_c8.size_ + 1) * 8))->_M_value;
                  fVar26 = (float)(_Var1 >> 0x20);
                  fVar17 = fVar30 * (float)_Var1 - fVar31 * fVar26;
                  fVar21 = (float)_Var1 * fVar31 + fVar26 * fVar30;
                  if ((NAN(fVar17)) && (NAN(fVar21))) {
                    local_b8 = CONCAT44(fVar40,fVar20);
                    uStack_b0 = CONCAT44(fVar24,fVar23);
                    __mulsc3(_Var1,fVar26,CONCAT44(fVar31,fVar30),fVar31);
                    fVar20 = (float)local_b8;
                    fVar40 = local_b8._4_4_;
                    fVar17 = extraout_XMM0_Da_00;
                    fVar21 = extraout_XMM0_Db_00;
                  }
                  (matrix->data_)._M_t.
                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                  [(lVar15 + lVar13) * matrix->size_ + lVar14]._M_value =
                       CONCAT44(fVar40 + fVar21,fVar20 + fVar17);
                  lVar13 = lVar13 + 1;
                  lVar12 = lVar12 + -1;
                } while (lVar12 != 0);
              }
              uVar6 = uVar6 + 1;
              lVar11 = lVar11 + lVar15 * 2;
            } while (uVar6 != uVar9);
            lVar11 = matrix->size_;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < lVar11);
      }
    }
  }
  else if (nbQubits == 1) {
    dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_68,&local_c8);
    dense::SquareMatrix<std::complex<float>_>::operator*=(&local_68,matrix);
    dense::SquareMatrix<std::complex<float>_>::SquareMatrix(&local_58,&local_68);
    dense::SquareMatrix<std::complex<float>_>::operator=(matrix,&local_58);
    if ((_Head_base<0UL,_std::complex<float>_*,_false>)
        local_58.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
        (_Head_base<0UL,_std::complex<float>_*,_false>)0x0) {
      operator_delete__((void *)local_58.data_._M_t.
                                super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
    }
    local_58.data_._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
          )(__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0;
    if (local_68.data_._M_t.
        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t
        .super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
        super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
      operator_delete__((void *)local_68.data_._M_t.
                                super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
    }
    local_68.data_._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
          )(__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0;
  }
  else {
    lVar11 = matrix->size_;
    if (0 < lVar11) {
      lVar15 = (long)(1 << ((byte)(~uVar5 + nbQubits) & 0x1f));
      uVar9 = 1 << ((byte)uVar5 & 0x1f);
      lVar10 = 1;
      if (1 < lVar15) {
        lVar10 = lVar15;
      }
      if ((int)uVar9 < 2) {
        uVar9 = 1;
      }
      lVar12 = 0;
      lVar14 = 0;
      do {
        if (uVar5 != 0x1f) {
          lVar11 = 0;
          uVar6 = 0;
          do {
            lVar13 = lVar11;
            lVar8 = lVar10;
            if (~uVar5 + nbQubits != 0x1f) {
              do {
                lVar7 = matrix->size_ * lVar12;
                pcVar3 = (matrix->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                         .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                fVar17 = *(float *)((long)&pcVar3->_M_value + lVar13 + lVar7);
                fVar21 = *(float *)((long)&pcVar3->_M_value + lVar13 + 4 + lVar7);
                _Var1 = *(_ComplexT *)((long)&pcVar3[lVar15]._M_value + lVar13 + lVar7);
                fVar31 = (float)(_Var1 >> 0x20);
                cVar2._M_value =
                     *(_ComplexT *)
                      local_c8.data_._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                fVar16 = (float)(cVar2._M_value >> 0x20);
                fVar27 = fVar17 * (float)cVar2._M_value - fVar21 * fVar16;
                fVar28 = fVar17 * 0.0 - fVar21 * 0.0;
                fVar29 = fVar17 * 0.0 - fVar21 * 0.0;
                fVar22 = fVar17 * fVar16 + fVar21 * (float)cVar2._M_value;
                fVar30 = (float)_Var1;
                uVar32 = 0;
                uVar33 = 0;
                uVar34 = 0;
                uVar35 = 0;
                uVar36 = 0;
                uVar37 = 0;
                uVar38 = 0;
                uVar39 = 0;
                fVar20 = fVar17;
                fVar40 = fVar17;
                fVar23 = fVar17;
                fVar24 = fVar17;
                fVar26 = fVar21;
                fVar41 = fVar21;
                fVar42 = fVar21;
                fVar43 = fVar21;
                if ((NAN(fVar27)) && (NAN(fVar22))) {
                  uStack_b0 = 0;
                  local_78 = ZEXT416((uint)fVar17);
                  local_88 = ZEXT416((uint)fVar21);
                  local_b8 = _Var1;
                  local_a8 = fVar21;
                  fStack_a4 = fVar21;
                  fStack_a0 = fVar21;
                  fStack_9c = fVar21;
                  local_98 = fVar17;
                  fStack_94 = fVar17;
                  fStack_90 = fVar17;
                  fStack_8c = fVar17;
                  uVar18 = __mulsc3(cVar2._M_value,fVar16,fVar17,fVar21);
                  fVar27 = (float)uVar18;
                  fVar22 = (float)((ulong)uVar18 >> 0x20);
                  fVar28 = (float)extraout_XMM0_Qb_01;
                  fVar29 = (float)((ulong)extraout_XMM0_Qb_01 >> 0x20);
                  fVar30 = (float)local_b8;
                  fVar31 = local_b8._4_4_;
                  uVar32 = (undefined4)uStack_b0;
                  uVar33 = uStack_b0._4_4_;
                  fVar17 = (float)local_78._0_4_;
                  uVar34 = local_78._4_4_;
                  uVar35 = local_78._8_4_;
                  uVar36 = local_78._12_4_;
                  fVar21 = (float)local_88._0_4_;
                  uVar37 = local_88._4_4_;
                  uVar38 = local_88._8_4_;
                  uVar39 = local_88._12_4_;
                  fVar20 = local_98;
                  fVar40 = fStack_94;
                  fVar23 = fStack_90;
                  fVar24 = fStack_8c;
                  fVar26 = local_a8;
                  fVar41 = fStack_a4;
                  fVar42 = fStack_a0;
                  fVar43 = fStack_9c;
                }
                _Var1 = ((complex<float> *)
                        ((long)local_c8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl +
                        local_c8.size_ * 8))->_M_value;
                fVar19 = (float)(_Var1 >> 0x20);
                fVar16 = fVar30 * (float)_Var1 - fVar31 * fVar19;
                fVar25 = (float)_Var1 * fVar31 + fVar19 * fVar30;
                if ((NAN(fVar16)) && (NAN(fVar25))) {
                  local_b8 = CONCAT44(fVar31,fVar30);
                  uStack_b0 = CONCAT44(uVar33,uVar32);
                  local_78._4_4_ = uVar34;
                  local_78._0_4_ = fVar17;
                  local_78._8_4_ = uVar35;
                  local_78._12_4_ = uVar36;
                  local_88._4_4_ = uVar37;
                  local_88._0_4_ = fVar21;
                  local_88._8_4_ = uVar38;
                  local_88._12_4_ = uVar39;
                  local_a8 = fVar26;
                  fStack_a4 = fVar41;
                  fStack_a0 = fVar42;
                  fStack_9c = fVar43;
                  local_98 = fVar20;
                  fStack_94 = fVar40;
                  fStack_90 = fVar23;
                  fStack_8c = fVar24;
                  local_48 = fVar27;
                  fStack_44 = fVar22;
                  fStack_40 = fVar28;
                  fStack_3c = fVar29;
                  uVar18 = __mulsc3(_Var1,fVar19,CONCAT44(fVar31,fVar30),fVar31);
                  fVar16 = (float)uVar18;
                  fVar25 = (float)((ulong)uVar18 >> 0x20);
                  fVar30 = (float)local_b8;
                  fVar31 = local_b8._4_4_;
                  uVar32 = (undefined4)uStack_b0;
                  uVar33 = uStack_b0._4_4_;
                  fVar17 = (float)local_78._0_4_;
                  uVar34 = local_78._4_4_;
                  fVar21 = (float)local_88._0_4_;
                  fVar20 = local_98;
                  fVar40 = fStack_94;
                  fVar23 = fStack_90;
                  fVar24 = fStack_8c;
                  fVar26 = local_a8;
                  fVar41 = fStack_a4;
                  fVar42 = fStack_a0;
                  fVar43 = fStack_9c;
                  fVar27 = local_48;
                  fVar22 = fStack_44;
                }
                *(ulong *)((long)&((matrix->data_)._M_t.
                                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                                  )->_M_value + lVar13 + matrix->size_ * lVar12) =
                     CONCAT44(fVar22 + fVar25,fVar27 + fVar16);
                _Var1 = ((complex<float> *)
                        ((long)local_c8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8
                        ))->_M_value;
                fVar27 = (float)(_Var1 >> 0x20);
                fVar20 = fVar20 * (float)_Var1 - fVar41 * fVar27;
                fVar23 = fVar23 * 0.0 - fVar42 * 0.0;
                fVar24 = fVar24 * 0.0 - fVar43 * 0.0;
                fVar40 = fVar40 * fVar27 + fVar26 * (float)_Var1;
                if ((NAN(fVar20)) && (NAN(fVar40))) {
                  local_b8 = CONCAT44(fVar31,fVar30);
                  uStack_b0 = CONCAT44(uVar33,uVar32);
                  uVar18 = __mulsc3(_Var1,fVar27,CONCAT44(uVar34,fVar17),fVar21);
                  fVar20 = (float)uVar18;
                  fVar40 = (float)((ulong)uVar18 >> 0x20);
                  fVar23 = (float)extraout_XMM0_Qb_02;
                  fVar24 = (float)((ulong)extraout_XMM0_Qb_02 >> 0x20);
                  fVar30 = (float)local_b8;
                  fVar31 = local_b8._4_4_;
                }
                _Var1 = ((complex<float> *)
                        ((long)local_c8.data_._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl +
                        (local_c8.size_ + 1) * 8))->_M_value;
                fVar21 = (float)(_Var1 >> 0x20);
                fVar17 = fVar30 * (float)_Var1 - fVar31 * fVar21;
                fVar26 = (float)_Var1 * fVar31 + fVar21 * fVar30;
                if ((NAN(fVar17)) && (NAN(fVar26))) {
                  local_b8 = CONCAT44(fVar40,fVar20);
                  uStack_b0 = CONCAT44(fVar24,fVar23);
                  uVar18 = __mulsc3(_Var1,fVar21,CONCAT44(fVar31,fVar30),fVar31);
                  fVar17 = (float)uVar18;
                  fVar26 = (float)((ulong)uVar18 >> 0x20);
                  fVar20 = (float)local_b8;
                  fVar40 = local_b8._4_4_;
                }
                *(ulong *)((long)&(matrix->data_)._M_t.
                                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                                  [lVar15]._M_value + lVar13 + matrix->size_ * lVar12) =
                     CONCAT44(fVar40 + fVar26,fVar20 + fVar17);
                lVar13 = lVar13 + 8;
                lVar8 = lVar8 + -1;
              } while (lVar8 != 0);
            }
            uVar6 = uVar6 + 1;
            lVar11 = lVar11 + lVar15 * 0x10;
          } while (uVar6 != uVar9);
          lVar11 = matrix->size_;
        }
        lVar14 = lVar14 + 1;
        lVar12 = lVar12 + 8;
      } while (lVar14 < lVar11);
    }
  }
  if (local_c8.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
    operator_delete__((void *)local_c8.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void QGate1< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 1 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit = this->qubit() + offset ;
    assert( qubit < nbQubits ) ;
    // operation
    qclab::dense::SquareMatrix< T >  mat1 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 1 ) {
        matrix *= mat1 ;
      } else {
        // matrix *= kron( Ileft , mat1 , Iright )
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 1 ) {
        matrix = mat1 * matrix ;
      } else {
        // matrix = kron( Ileft , mat1 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubit ;
        const int64_t nRight = 1 << ( nbQubits - qubit - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }